

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

void HostGame(int i)

{
  int iVar1;
  uint uVar2;
  char *__nptr;
  long lVar3;
  long lVar4;
  PreGamePacket packet;
  int gotack [9];
  undefined2 local_9c [34];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  iVar1 = DArgs::NumArgs(Args);
  if (iVar1 + -1 != i) {
    __nptr = DArgs::GetArg(Args,i + 1);
    uVar2 = atoi(__nptr);
    if (uVar2 != 0) goto LAB_004be76a;
  }
  uVar2 = 2;
LAB_004be76a:
  if (8 < (int)uVar2) {
    I_FatalError("You cannot host a game with %d players. The limit is currently %d.",(ulong)uVar2,8
                );
    return;
  }
  if (uVar2 == 1) {
    multiplayer = true;
    netgame = false;
    doomcom.consoleplayer = 0;
    doomcom.numplayers = 1;
    doomcom.numnodes = 1;
    doomcom.id = 0x12345678;
    return;
  }
  StartNetwork(false);
  doomcom._16_4_ = doomcom._16_4_ & 0xffff0000;
  Printf("Console player number: %d\n",0);
  doomcom.numnodes = 1;
  addterm(SendAbort,"SendAbort");
  (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Waiting for players",(ulong)uVar2);
  iVar1 = (*StartScreen->_vptr_FStartupScreen[9])
                    (StartScreen,Host_CheckForConnects,(long)(int)uVar2);
  if ((char)iVar1 != '\0') {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_38 = 0;
    (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Sending all here.");
    (*StartScreen->_vptr_FStartupScreen[5])(StartScreen,"Done waiting",1);
    iVar1 = (*StartScreen->_vptr_FStartupScreen[9])(StartScreen,Host_SendAllHere,&local_58);
    if ((char)iVar1 != '\0') {
      popterm();
      (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Go");
      local_9c[0] = 0x730;
      if (1 < doomcom.numnodes) {
        lVar4 = 1;
        do {
          iVar1 = -8;
          do {
            sendto(mysocket,local_9c,2,0,(sockaddr *)(sendaddress + lVar4),0x10);
            iVar1 = iVar1 + 1;
          } while (iVar1 != 0);
          lVar4 = lVar4 + 1;
        } while (lVar4 < doomcom.numnodes);
      }
      (*StartScreen->_vptr_FStartupScreen[7])
                (StartScreen,"Total players: %d",(ulong)(uint)(int)doomcom.numnodes);
      doomcom.id = 0x12345678;
      lVar4 = (long)doomcom.numnodes;
      doomcom.numplayers = doomcom.numnodes;
      if (lVar4 < 1) {
        doomcom.id = 0x12345678;
        return;
      }
      lVar3 = 0;
      do {
        sendplayer[lVar3] = (BYTE)lVar3;
        lVar3 = lVar3 + 1;
      } while (lVar4 != lVar3);
      return;
    }
  }
  exit(0);
}

Assistant:

void HostGame (int i)
{
	PreGamePacket packet;
	int numplayers;
	int node;
	int gotack[MAXNETNODES+1];

	if ((i == Args->NumArgs() - 1) || !(numplayers = atoi (Args->GetArg(i+1))))
	{	// No player count specified, assume 2
		numplayers = 2;
	}

	if (numplayers > MAXNETNODES)
	{
		I_FatalError("You cannot host a game with %d players. The limit is currently %d.", numplayers, MAXNETNODES);
		return;
	}

	if (numplayers == 1)
	{ // Special case: Only 1 player, so don't bother starting the network
		netgame = false;
		multiplayer = true;
		doomcom.id = DOOMCOM_ID;
		doomcom.numplayers = doomcom.numnodes = 1;
		doomcom.consoleplayer = 0;
		return;
	}

	StartNetwork (false);

	// [JC] - this computer is starting the game, therefore it should
	// be the Net Arbitrator.
	doomcom.consoleplayer = 0;
	Printf ("Console player number: %d\n", doomcom.consoleplayer);

	doomcom.numnodes = 1;

	atterm (SendAbort);

	StartScreen->NetInit ("Waiting for players", numplayers);

	// Wait for numplayers-1 different connections
	if (!StartScreen->NetLoop (Host_CheckForConnects, (void *)(intptr_t)numplayers))
	{
		exit (0);
	}

	// Now inform everyone of all machines involved in the game
	memset (gotack, 0, sizeof(gotack));
	StartScreen->NetMessage ("Sending all here.");
	StartScreen->NetInit ("Done waiting", 1);

	if (!StartScreen->NetLoop (Host_SendAllHere, (void *)gotack))
	{
		exit (0);
	}

	popterm ();

	// Now go
	StartScreen->NetMessage ("Go");
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_GO;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		// If we send the packets eight times to each guest,
		// hopefully at least one of them will get through.
		for (int i = 8; i != 0; --i)
		{
			PreSend (&packet, 2, &sendaddress[node]);
		}
	}

	StartScreen->NetMessage ("Total players: %d", doomcom.numnodes);

	doomcom.id = DOOMCOM_ID;
	doomcom.numplayers = doomcom.numnodes;

	// On the host, each player's number is the same as its node number
	for (i = 0; i < doomcom.numnodes; ++i)
	{
		sendplayer[i] = i;
	}
}